

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

string * mp::internal::
         OptionHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::Parse(string *__return_storage_ptr__,char **s,bool splitString)

{
  char *pcVar1;
  undefined7 in_register_00000011;
  char *s_00;
  
  s_00 = *s;
  if ((int)CONCAT71(in_register_00000011,splitString) == 0) {
    if ((*s_00 == '\'') || (*s_00 == '\"')) {
      pcVar1 = SkipToMatchingQuote(s_00);
      *s = pcVar1;
      s_00 = s_00 + 1;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = pcVar1 + -1;
      goto LAB_0027e0d0;
    }
    pcVar1 = SkipNonSpaces(s_00);
  }
  else {
    pcVar1 = SkipToEnd(s_00);
  }
  *s = pcVar1;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
LAB_0027e0d0:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,s_00,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string OptionHelper<std::string>::Parse(const char *&s, bool splitString) {
  const char *start = s;
  if (splitString) // if the string has been already split (by the command line parser)
  {                // @todo consider quotes here too?
    s = SkipToEnd(s);
    return std::string(start, s - start);
  }
  if (quoted(s))
  {
    s = SkipToMatchingQuote(s);
    return std::string(start + 1, s - start - 2);
  }
  {
    s = SkipNonSpaces(s);
    return std::string(start, s - start);
  }
}